

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgroup_controller.cpp
# Opt level: O2

void __thiscall CgroupController::CgroupController(CgroupController *this,string *name,string *id)

{
  pointer pcVar1;
  Config *this_00;
  path *__lhs;
  ContextManager *pCVar2;
  error_code error;
  path local_e8;
  path local_c0;
  path local_98;
  path local_70;
  path local_48;
  
  std::filesystem::__cxx11::path::path(&this->path_);
  this->enter_fd_ = -1;
  this_00 = Config::get();
  __lhs = Config::get_cgroup_root_abi_cxx11_(this_00);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_48,name,auto_format);
  std::filesystem::__cxx11::operator/((path *)&error,__lhs,&local_48);
  std::filesystem::__cxx11::path::path<char[8],std::filesystem::__cxx11::path>
            (&local_70,(char (*) [8])"libsbox",auto_format);
  std::filesystem::__cxx11::operator/(&local_e8,(path *)&error,&local_70);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_98,id,auto_format);
  std::filesystem::__cxx11::operator/(&local_c0,&local_e8,&local_98);
  std::filesystem::__cxx11::path::operator=(&this->path_,&local_c0);
  std::filesystem::__cxx11::path::~path(&local_c0);
  std::filesystem::__cxx11::path::~path(&local_98);
  std::filesystem::__cxx11::path::~path(&local_e8);
  std::filesystem::__cxx11::path::~path(&local_70);
  std::filesystem::__cxx11::path::~path((path *)&error);
  std::filesystem::__cxx11::path::~path(&local_48);
  error._M_value = 0;
  error._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::create_directories(&this->path_,&error);
  if (error._M_value != 0) {
    pCVar2 = ContextManager::get();
    pcVar1 = (this->path_)._M_pathname._M_dataplus._M_p;
    (**(code **)(*(long *)error._M_cat + 0x20))(&local_e8,error._M_cat,error._M_value);
    format_abi_cxx11_(&local_c0._M_pathname,"Cannot create dir \'%s\': %s",pcVar1,
                      local_e8._M_pathname._M_dataplus._M_p);
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  return;
}

Assistant:

CgroupController::CgroupController(const std::string &name, const std::string &id) {
    path_ = Config::get().get_cgroup_root() / name / "libsbox" / id;
    std::error_code error;
    fs::create_directories(path_, error);
    if (error) {
        die(format("Cannot create dir '%s': %s", path_.c_str(), error.message().c_str()));
    }
}